

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::SGXMLScanner::scanCDSection(SGXMLScanner *this)

{
  XMLDocumentHandler *pXVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  XMLCh toCheck;
  short sVar5;
  int iVar6;
  ComplexTypeInfo *this_00;
  StackElem *pSVar7;
  UnexpectedEOFException *this_01;
  XMLReader *pXVar8;
  DatatypeValidator *this_02;
  XMLCh *pXVar9;
  XMLSize_t XVar10;
  XMLCh local_88 [4];
  XMLCh tmpBuf [9];
  DatatypeValidator *tempDV;
  XMLCh *xsNormalized;
  XMLSize_t xsLen;
  XMLCh nextCh;
  StackElem *topElem;
  ModelTypes modelType;
  ComplexTypeInfo *currType;
  CharDataOpts charOpts;
  bool gotLeadingSurrogate;
  bool emittedError;
  XMLBufBid bbCData;
  SGXMLScanner *this_local;
  
  bbCData.fMgr = (XMLBufferMgr *)this;
  bVar3 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'[');
  if (!bVar3) {
    XMLScanner::emitError(&this->super_XMLScanner,ExpectedOpenSquareBracket);
    ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
    bVar3 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'[');
    if (!bVar3) {
      return;
    }
  }
  XMLBufBid::XMLBufBid((XMLBufBid *)&charOpts,&(this->super_XMLScanner).fBufMgr);
  bVar2 = false;
  bVar3 = false;
  currType._0_4_ = 2;
  this_00 = SchemaValidator::getCurrentTypeInfo
                      ((SchemaValidator *)(this->super_XMLScanner).fValidator);
  if (this_00 != (ComplexTypeInfo *)0x0) {
    iVar6 = ComplexTypeInfo::getContentType(this_00);
    if ((iVar6 == 4) || (iVar6 == 6)) {
      currType._0_4_ = 1;
    }
    else if (iVar6 == 0) {
      currType._0_4_ = 0;
    }
  }
  pSVar7 = ElemStack::topElement(&(this->super_XMLScanner).fElemStack);
  while( true ) {
    toCheck = ReaderMgr::getNextChar(&(this->super_XMLScanner).fReaderMgr);
    if (toCheck == L'\0') {
      XMLScanner::emitError(&this->super_XMLScanner,UnterminatedCDATASection);
      this_01 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (this_01,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/SGXMLScanner.cpp"
                 ,0x109a,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(this_01,&UnexpectedEOFException::typeinfo,
                  UnexpectedEOFException::~UnexpectedEOFException);
    }
    if ((((this->super_XMLScanner).fValidate & 1U) != 0) &&
       (((this->super_XMLScanner).fStandalone & 1U) != 0)) {
      pXVar8 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
      bVar4 = XMLReader::isWhitespace(pXVar8,toCheck);
      if ((bVar4) &&
         ((bVar4 = XMLElementDecl::isExternal(pSVar7->fThisElement), bVar4 && ((int)currType == 1)))
         ) {
        XMLValidator::emitError((this->super_XMLScanner).fValidator,NoWSForStandalone);
        XMLScanner::getPSVIHandler(&this->super_XMLScanner);
      }
    }
    if ((toCheck == L']') &&
       (bVar4 = ReaderMgr::skippedString(&(this->super_XMLScanner).fReaderMgr,L"]>"), bVar4)) break;
    if (!bVar2) {
      if (((ushort)toCheck < 0xd800) || (0xdbff < (ushort)toCheck)) {
        if (((ushort)toCheck < 0xdc00) || (0xdfff < (ushort)toCheck)) {
          if (bVar3) {
            XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
          }
          else {
            pXVar8 = ReaderMgr::getCurrentReader(&(this->super_XMLScanner).fReaderMgr);
            bVar3 = XMLReader::isXMLChar(pXVar8,toCheck);
            if (!bVar3) {
              XMLString::binToText
                        ((uint)(ushort)toCheck,local_88,8,0x10,
                         (this->super_XMLScanner).fMemoryManager);
              XMLScanner::emitError
                        (&this->super_XMLScanner,InvalidCharacter,local_88,(XMLCh *)0x0,(XMLCh *)0x0
                         ,(XMLCh *)0x0);
              bVar2 = true;
            }
          }
        }
        else if (!bVar3) {
          XMLScanner::emitError(&this->super_XMLScanner,Unexpected2ndSurrogateChar);
        }
        bVar3 = false;
      }
      else if (bVar3) {
        XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
      }
      else {
        bVar3 = true;
      }
    }
    XMLBufBid::append((XMLBufBid *)&charOpts,toCheck);
  }
  if (bVar3) {
    XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
  }
  xsNormalized = (XMLCh *)XMLBufBid::getLen((XMLBufBid *)&charOpts);
  tempDV = (DatatypeValidator *)XMLBufBid::getRawBuffer((XMLBufBid *)&charOpts);
  if (((this->super_XMLScanner).fValidate & 1U) != 0) {
    this_02 = SchemaValidator::getCurrentDatatypeValidator
                        ((SchemaValidator *)(this->super_XMLScanner).fValidator);
    if ((this_02 != (DatatypeValidator *)0x0) &&
       (sVar5 = DatatypeValidator::getWSFacet(this_02), sVar5 != 0)) {
      SchemaValidator::normalizeWhiteSpace
                ((SchemaValidator *)(this->super_XMLScanner).fValidator,this_02,(XMLCh *)tempDV,
                 &(this->super_XMLScanner).fWSNormalizeBuf,false);
      tempDV = (DatatypeValidator *)
               XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fWSNormalizeBuf);
      xsNormalized = (XMLCh *)XMLBuffer::getLen(&(this->super_XMLScanner).fWSNormalizeBuf);
    }
    SchemaValidator::setDatatypeBuffer
              ((SchemaValidator *)(this->super_XMLScanner).fValidator,(XMLCh *)tempDV);
    if ((int)currType != 2) {
      XMLValidator::emitError((this->super_XMLScanner).fValidator,NoCharDataInCM);
      XMLScanner::getPSVIHandler(&this->super_XMLScanner);
    }
  }
  bVar3 = toCheckIdentityConstraint(this);
  if ((bVar3) &&
     (XVar10 = IdentityConstraintHandler::getMatcherCount(this->fICHandler), XVar10 != 0)) {
    XMLBuffer::append(&this->fContent,(XMLCh *)tempDV,(XMLSize_t)xsNormalized);
  }
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    if (((this->super_XMLScanner).fNormalizeData & 1U) == 0) {
      pXVar1 = (this->super_XMLScanner).fDocHandler;
      pXVar9 = XMLBufBid::getRawBuffer((XMLBufBid *)&charOpts);
      XVar10 = XMLBufBid::getLen((XMLBufBid *)&charOpts);
      (*pXVar1->_vptr_XMLDocumentHandler[2])(pXVar1,pXVar9,XVar10,1);
    }
    else {
      pXVar1 = (this->super_XMLScanner).fDocHandler;
      (*pXVar1->_vptr_XMLDocumentHandler[2])(pXVar1,tempDV,xsNormalized,1);
    }
  }
  XMLBufBid::~XMLBufBid((XMLBufBid *)&charOpts);
  return;
}

Assistant:

void SGXMLScanner::scanCDSection()
{
    static const XMLCh CDataClose[] =
    {
            chCloseSquare, chCloseAngle, chNull
    };

    //  The next character should be the opening square bracket. If not
    //  issue an error, but then try to recover by skipping any whitespace
    //  and checking again.
    if (!fReaderMgr.skippedChar(chOpenSquare))
    {
        emitError(XMLErrs::ExpectedOpenSquareBracket);
        fReaderMgr.skipPastSpaces();

        // If we still don't find it, then give up, else keep going
        if (!fReaderMgr.skippedChar(chOpenSquare))
            return;
    }

    // Get a buffer for this
    XMLBufBid bbCData(&fBufMgr);

    //  We just scan forward until we hit the end of CDATA section sequence.
    //  CDATA is effectively a big escape mechanism so we don't treat markup
    //  characters specially here.
    bool            emittedError = false;
    bool    gotLeadingSurrogate = false;

    // Get the character data opts for the current element
    XMLElementDecl::CharDataOpts charOpts = XMLElementDecl::AllCharData;
    // And see if the current element is a 'Children' style content model
    ComplexTypeInfo *currType = ((SchemaValidator*)fValidator)->getCurrentTypeInfo();
    if(currType)
    {
        SchemaElementDecl::ModelTypes modelType = (SchemaElementDecl::ModelTypes) currType->getContentType();
        if(modelType == SchemaElementDecl::Children ||
           modelType == SchemaElementDecl::ElementOnlyEmpty)
            charOpts = XMLElementDecl::SpacesOk;
        else if(modelType == SchemaElementDecl::Empty)
            charOpts = XMLElementDecl::NoCharData;
    }

    // should not be necessary when PSVI on element decl removed
    const ElemStack::StackElem* topElem = fElemStack.topElement();

    while (true)
    {
        const XMLCh nextCh = fReaderMgr.getNextChar();

        // Watch for unexpected end of file
        if (!nextCh)
        {
            emitError(XMLErrs::UnterminatedCDATASection);
            ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);
        }

        if (fValidate && fStandalone && (fReaderMgr.getCurrentReader()->isWhitespace(nextCh)))
        {
            // This document is standalone; this ignorable CDATA whitespace is forbidden.
            // XML 1.0, Section 2.9
            // And see if the current element is a 'Children' style content model
            if (topElem->fThisElement->isExternal()) {

                if (charOpts == XMLElementDecl::SpacesOk) // Element Content
                {
                    // Error - standalone should have a value of "no" as whitespace detected in an
                    // element type with element content whose element declaration was external
                    fValidator->emitError(XMLValid::NoWSForStandalone);
                    if (getPSVIHandler())
                    {
                        // REVISIT:
                        // PSVIElement->setValidity(PSVIItem::VALIDITY_INVALID);
                    }
                }
            }
        }

        //  If this is a close square bracket it could be our closing
        //  sequence.
        if (nextCh == chCloseSquare && fReaderMgr.skippedString(CDataClose))
        {
            //  make sure we were not expecting a trailing surrogate.
            if (gotLeadingSurrogate) {
                emitError(XMLErrs::Expected2ndSurrogateChar);
            }

            XMLSize_t xsLen = bbCData.getLen();
            const XMLCh* xsNormalized = bbCData.getRawBuffer();
            if (fValidate) {

                DatatypeValidator* tempDV = ((SchemaValidator*) fValidator)->getCurrentDatatypeValidator();
                if (tempDV && tempDV->getWSFacet() != DatatypeValidator::PRESERVE)
                {
                    // normalize the character according to schema whitespace facet
                    ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, xsNormalized, fWSNormalizeBuf);
                    xsNormalized = fWSNormalizeBuf.getRawBuffer();
                    xsLen = fWSNormalizeBuf.getLen();
                }

                // tell the schema validation about the character data for checkContent later
                ((SchemaValidator*)fValidator)->setDatatypeBuffer(xsNormalized);

                if (charOpts != XMLElementDecl::AllCharData)
                {
                    // They definitely cannot handle any type of char data
                    fValidator->emitError(XMLValid::NoCharDataInCM);
                    if (getPSVIHandler())
                    {
                        // REVISIT:
                        // PSVIElement->setValidity(PSVIItem::VALIDITY_INVALID);
                    }
                }
            }

            // call all active identity constraints
            if (toCheckIdentityConstraint() && fICHandler->getMatcherCount()) {
                fContent.append(xsNormalized, xsLen);
            }

            // If we have a doc handler, call it
            if (fDocHandler)
            {
                if (fNormalizeData) {
                    fDocHandler->docCharacters(xsNormalized, xsLen, true);
                }
                else {
                    fDocHandler->docCharacters(
                        bbCData.getRawBuffer(), bbCData.getLen(), true
                    );
                }
            }

            // And we are done
            break;
        }

        //  Make sure its a valid character. But if we've emitted an error
        //  already, don't bother with the overhead since we've already told
        //  them about it.
        if (!emittedError)
        {
            // Deal with surrogate pairs
            if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                //  Its a leading surrogate. If we already got one, then
                //  issue an error, else set leading flag to make sure that
                //  we look for a trailing next time.
                if (gotLeadingSurrogate)
                    emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
            else
            {
                //  If its a trailing surrogate, make sure that we are
                //  prepared for that. Else, its just a regular char so make
                //  sure that we were not expected a trailing surrogate.
                if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                {
                    // Its trailing, so make sure we were expecting it
                    if (!gotLeadingSurrogate)
                        emitError(XMLErrs::Unexpected2ndSurrogateChar);
                }
                else
                {
                    //  Its just a char, so make sure we were not expecting a
                    //  trailing surrogate.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    // Its got to at least be a valid XML character
                    else if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                    {
                        XMLCh tmpBuf[9];
                        XMLString::binToText
                        (
                            nextCh
                            , tmpBuf
                            , 8
                            , 16
                            , fMemoryManager
                        );
                        emitError(XMLErrs::InvalidCharacter, tmpBuf);
                        emittedError = true;
                    }
                }
                gotLeadingSurrogate = false;
            }
        }

        // Add it to the buffer
        bbCData.append(nextCh);
    }
}